

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dieharder_file.cc
# Opt level: O0

void add_generator<trng::lcg64_count_shift>
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(unsigned_long,_unsigned_long)>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(unsigned_long,_unsigned_long)>_>_>_>
                *func_map)

{
  parameter_type P;
  char *pcVar1;
  mapped_type *__f;
  function<void_(unsigned_long,_unsigned_long)> *in_RDI;
  lcg64_count_shift r;
  result_type in_stack_ffffffffffffff50;
  key_type *in_stack_ffffffffffffff78;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(unsigned_long,_unsigned_long)>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(unsigned_long,_unsigned_long)>_>_>_>
  *in_stack_ffffffffffffff80;
  allocator local_71;
  string local_70 [40];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  function<void_(unsigned_long,_unsigned_long)> *local_8;
  
  local_38 = DAT_0011d2a0;
  local_48 = trng::lcg64_count_shift::Default;
  uStack_40 = DAT_0011d298;
  P.b = DAT_0011d2a0;
  P.a = DAT_0011d298;
  P.inc = in_stack_ffffffffffffff50;
  local_8 = in_RDI;
  trng::lcg64_count_shift::lcg64_count_shift((lcg64_count_shift *)0x1035f4,P);
  pcVar1 = trng::lcg64_count_shift::name();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,pcVar1,&local_71);
  __f = std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(unsigned_long,_unsigned_long)>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(unsigned_long,_unsigned_long)>_>_>_>
        ::operator[](in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  std::function<void(unsigned_long,unsigned_long)>::operator=
            (local_8,(anon_class_1_0_00000001 *)__f);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  return;
}

Assistant:

void add_generator(
    std::map<std::string, std::function<void(std::size_t, unsigned long)>> &func_map) {
  const R r;
  func_map[r.name()] = [&](std::size_t samples, unsigned long seed) {
    generate<R>(samples, seed);
  };
}